

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void multi_thread_test(size_t ndocs,size_t wal_threshold,size_t time_sec,size_t nbatch,
                      size_t compact_term,size_t nwriters,size_t nreaders)

{
  int iVar1;
  pthread_t pVar2;
  fdb_doc *pfVar3;
  fdb_kvs_handle *pfVar4;
  list *__th;
  undefined7 uVar5;
  fdb_kvs_config *pfVar6;
  fdb_status fVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  fdb_doc *pfVar14;
  fdb_kvs_handle *pfVar15;
  pthread_t *ppVar16;
  void **ppvVar17;
  fdb_kvs_config *pfVar18;
  fdb_kvs_config *pfVar19;
  void *pvVar20;
  void *pvVar21;
  uint uVar22;
  size_t sVar23;
  fdb_kvs_config *pfVar24;
  fdb_custom_cmp_variable *pp_Var25;
  fdb_custom_cmp_variable *pp_Var26;
  fdb_kvs_config *pfVar27;
  char cVar28;
  fdb_custom_cmp_variable *pp_Var29;
  fdb_custom_cmp_variable *pp_Var30;
  fdb_custom_cmp_variable *pp_Var31;
  fdb_custom_cmp_variable *pp_Var32;
  fdb_custom_cmp_variable *pp_Var33;
  fdb_custom_cmp_variable *pp_Var34;
  char *pcVar35;
  fdb_file_handle *pfVar36;
  void **ppvVar37;
  code *pcVar38;
  void **__arg;
  pthread_t *__newthread;
  long lVar39;
  fdb_config *fconfig_00;
  undefined4 uVar40;
  undefined4 uVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  fdb_kvs_config fStack_1cf0;
  fdb_kvs_config afStack_1cd8 [6];
  void *apvStack_1c38 [17];
  fdb_custom_cmp_variable p_Stack_1bb0;
  void *pvStack_1ba8;
  undefined1 auStack_1ba0 [416];
  fdb_custom_cmp_variable p_Stack_1a00;
  void *pvStack_19f8;
  fdb_kvs_config fStack_19f0;
  undefined1 auStack_19d1 [201];
  void *apvStack_1908 [10];
  undefined1 auStack_18b8 [416];
  fdb_custom_cmp_variable ap_Stack_1718 [32];
  fdb_kvs_config afStack_1618 [10];
  void *pvStack_1518;
  fdb_kvs_config afStack_1510 [10];
  fdb_custom_cmp_variable ap_Stack_1418 [2];
  fdb_kvs_config fStack_1408;
  fdb_custom_cmp_variable p_Stack_13e8;
  void *pvStack_13e0;
  fdb_kvs_config fStack_13d8;
  fdb_custom_cmp_variable p_Stack_13b8;
  void *pvStack_13b0;
  fdb_kvs_config fStack_13a8;
  fdb_kvs_config fStack_1390;
  fdb_config fStack_1378;
  fdb_custom_cmp_variable ap_Stack_1280 [2];
  fdb_kvs_config fStack_1270;
  fdb_custom_cmp_variable p_Stack_1250;
  void *pvStack_1248;
  fdb_kvs_config fStack_1240;
  undefined1 local_1228 [8];
  char keybuf [1024];
  char metabuf [1024];
  char bodybuf [1024];
  char temp [1024];
  fdb_config fconfig;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  timeval ts_cur;
  fdb_kvs_config kvs_config;
  timeval ts_begin;
  undefined4 local_58;
  pthread_spinlock_t local_54;
  int n_opened;
  pthread_spinlock_t filename_count_lock;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  uint local_34 [2];
  int filename_count;
  
  fStack_1240.custom_cmp_param = (void *)0x11362f;
  gettimeofday((timeval *)&kvs_info.file,(__timezone_ptr_t)0x0);
  db = (fdb_kvs_handle *)(nreaders + nwriters);
  pvVar20 = (void *)(long)(int)db;
  uVar9 = (long)pvVar20 * 8 + 0xfU & 0xfffffffffffffff0;
  ppVar16 = (pthread_t *)(local_1228 + -uVar9);
  ppvVar17 = (void **)((long)ppVar16 - uVar9);
  ppvVar37 = ppvVar17 + (long)pvVar20 * -0xe;
  pfVar18 = (fdb_kvs_config *)((long)ppvVar37 - (ndocs * 8 + 0xf & 0xfffffffffffffff0));
  local_34[0] = 1;
  local_58 = 0;
  pfVar18[-1].custom_cmp_param = (void *)0x1136bb;
  pfVar19 = pfVar18;
  pthread_spin_init(&local_54,1);
  pfVar18[-1].custom_cmp_param = (void *)0x1136c7;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = (fdb_config *)(temp + 0x3f8);
  pfVar18[-1].custom_cmp_param = (void *)0x1136d6;
  fdb_get_default_config();
  pfVar18[-1].custom_cmp_param = (void *)0x1136e5;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  pfVar18[-1].custom_cmp_param = (void *)0x113703;
  memleak_start();
  pfVar18[-1].custom_cmp_param = (void *)0x11370f;
  puts("Initialize..");
  pfVar18[-1].custom_cmp_param = (void *)0x11372c;
  sprintf(bodybuf + 0x3f8,"dummy%d",1);
  pfVar18[-1].custom_cmp_param = (void *)0x11373e;
  fdb_open((fdb_file_handle **)&n_opened,bodybuf + 0x3f8,fconfig_00);
  pfVar18[-1].custom_cmp_param = (void *)0x113750;
  fdb_kvs_open_default(_n_opened,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&ts_cur.tv_usec);
  pfVar18[-1].custom_cmp_param = (void *)0x113766;
  pfVar36 = dbfile;
  fVar7 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"multi_thread_test");
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pfVar18[-1].custom_cmp_param = (void *)0x11377c;
    gettimeofday((timeval *)&kvs_config.custom_cmp_param,(__timezone_ptr_t)0x0);
    if (ndocs != 0) {
      uVar9 = 0;
      pfVar19 = pfVar18;
      do {
        pcVar35 = bodybuf + 0x3f8;
        pfVar18[-1].custom_cmp_param = (void *)0x1137a3;
        _set_random_string_smallabt(pcVar35,0x5c);
        pfVar18[-1].custom_cmp_param = (void *)0x1137c1;
        sprintf(local_1228,"k%07d%s",uVar9 & 0xffffffff,pcVar35);
        pfVar18[-1].custom_cmp_param = (void *)0x1137d9;
        sprintf(keybuf + 0x3f8,"m%07d",uVar9 & 0xffffffff);
        pfVar18[-1].custom_cmp_param = (void *)0x1137e6;
        _set_random_string_smallabt(pcVar35,0x55);
        pfVar18[-1].custom_cmp_param = (void *)0x113803;
        sprintf(metabuf + 0x3f8,"b%07d%07d%s",uVar9 & 0xffffffff,0,pcVar35);
        pfVar18[-1].custom_cmp_param = (void *)0x11380b;
        sVar10 = strlen(local_1228);
        pfVar18[-1].custom_cmp_param = (void *)0x11381a;
        sVar11 = strlen(keybuf + 0x3f8);
        pfVar18[-1].custom_cmp_param = (void *)0x113829;
        sVar12 = strlen(metabuf + 0x3f8);
        pfVar18[-1].custom_cmp = (fdb_custom_cmp_variable)sVar12;
        *(undefined8 *)(pfVar18 + -1) = 0x113851;
        fdb_doc_create((fdb_doc **)pfVar19,local_1228,sVar10,keybuf + 0x3f8,sVar11,metabuf + 0x3f8,
                       (size_t)pfVar18[-1].custom_cmp);
        pfVar14 = *(fdb_doc **)pfVar19;
        pfVar18[-1].custom_cmp_param = (void *)0x113861;
        fdb_set((fdb_kvs_handle *)dbfile,pfVar14);
        uVar9 = uVar9 + 1;
        pfVar19 = (fdb_kvs_config *)&pfVar19->custom_cmp;
      } while (ndocs != uVar9);
    }
    pfVar18[-1].custom_cmp_param = (void *)0x11387f;
    fdb_commit(_n_opened,'\x01');
    pfVar18[-1].custom_cmp_param = (void *)0x113890;
    gettimeofday((timeval *)&__test_begin.tv_usec,(__timezone_ptr_t)0x0);
    pfVar18[-1].custom_cmp_param = (void *)0x1138aa;
    _utime_gap(stack0xffffffffffffff38,stack0xffffffffffffff10);
    pfVar18[-1].custom_cmp_param = (void *)0x1138b3;
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    pfVar18[-1].custom_cmp_param = (void *)0x1138bc;
    fdb_close(_n_opened);
    uVar22 = (uint)db;
    if ((int)uVar22 < 1) {
      pfVar18[-1].custom_cmp_param = (void *)0x1139e9;
      printf("wait for %d seconds..\n");
    }
    else {
      uVar9 = 0;
      __arg = ppvVar37;
      __newthread = ppVar16;
      do {
        *(int *)__arg = (int)uVar9;
        __arg[1] = pvVar20;
        __arg[3] = (void *)(ulong)(uVar9 < nwriters);
        __arg[2] = (void *)ndocs;
        __arg[4] = pfVar18;
        __arg[5] = (void *)time_sec;
        __arg[6] = (void *)nbatch;
        __arg[7] = (void *)compact_term;
        __arg[8] = &local_58;
        __arg[9] = local_34;
        __arg[10] = &local_54;
        __arg[0xc] = temp + 0x3f8;
        __arg[0xd] = &ts_cur.tv_usec;
        pfVar18[-1].custom_cmp_param = (void *)0x113973;
        pthread_create(__newthread,(pthread_attr_t *)0x0,_worker_thread,__arg);
        uVar9 = uVar9 + 1;
        __newthread = __newthread + 1;
        __arg = __arg + 0xe;
      } while ((uVar22 & 0x7fffffff) != uVar9);
      pfVar18[-1].custom_cmp_param = (void *)0x11399c;
      printf("wait for %d seconds..\n");
      if (0 < (int)(uint)db) {
        uVar22 = (uint)db & 0x7fffffff;
        uVar9 = 0;
        do {
          pVar2 = ppVar16[uVar9];
          pfVar18[-1].custom_cmp_param = (void *)0x1139c6;
          pthread_join(pVar2,ppvVar17);
          uVar9 = uVar9 + 1;
          ppvVar17 = ppvVar17 + 1;
        } while (uVar22 != uVar9);
      }
    }
    if (ndocs != 0) {
      sVar23 = 0;
      do {
        pfVar14 = *(fdb_doc **)(&pfVar18->create_if_missing + sVar23 * 8);
        pfVar18[-1].custom_cmp_param = (void *)0x113a01;
        fdb_doc_free(pfVar14);
        sVar23 = sVar23 + 1;
      } while (ndocs != sVar23);
    }
    if ((int)(uint)db < 1) {
      dVar42 = 0.0;
      lVar39 = 0;
    }
    else {
      uVar9 = (ulong)((uint)db & 0x7fffffff);
      ppvVar37 = ppvVar37 + 0xb;
      lVar39 = 0;
      lVar13 = 0;
      do {
        pvVar21 = *ppvVar37;
        pvVar20 = (void *)0x0;
        if (ppvVar37[-8] == (void *)0x0) {
          pvVar21 = (void *)0x0;
          pvVar20 = *ppvVar37;
        }
        lVar13 = lVar13 + (long)pvVar20;
        lVar39 = lVar39 + (long)pvVar21;
        ppvVar37 = ppvVar37 + 0xe;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      auVar43._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar43._0_8_ = lVar13;
      auVar43._12_4_ = 0x45300000;
      dVar42 = (auVar43._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
    }
    auVar44._8_4_ = (int)(time_sec >> 0x20);
    auVar44._0_8_ = time_sec;
    auVar44._12_4_ = 0x45300000;
    dVar46 = (auVar44._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)time_sec) - 4503599627370496.0);
    pfVar18[-1].custom_cmp_param = (void *)0x113aac;
    printf("read: %.1f ops/sec\n",SUB84(dVar42 / dVar46,0));
    auVar45._8_4_ = (int)((ulong)lVar39 >> 0x20);
    auVar45._0_8_ = lVar39;
    auVar45._12_4_ = 0x45300000;
    pfVar18[-1].custom_cmp_param = (void *)0x113ae0;
    printf("write: %.1f ops/sec\n",
           SUB84(((auVar45._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar39) - 4503599627370496.0)) / dVar46,0));
    pfVar18[-1].custom_cmp_param = (void *)0x113afb;
    sprintf(bodybuf + 0x3f8,"dummy%d",(ulong)local_34[0]);
    pfVar18[-1].custom_cmp_param = (void *)0x113b11;
    fdb_open((fdb_file_handle **)&n_opened,bodybuf + 0x3f8,(fdb_config *)(temp + 0x3f8));
    pfVar18[-1].custom_cmp_param = (void *)0x113b27;
    fdb_kvs_open_default(_n_opened,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&ts_cur.tv_usec);
    pfVar18[-1].custom_cmp_param = (void *)0x113b39;
    fdb_get_kvs_info((fdb_kvs_handle *)dbfile,(fdb_kvs_info *)&fconfig.num_blocks_readahead);
    if (kvs_info.name != (char *)(ndocs + lVar39)) {
      pfVar18[-1].custom_cmp_param = (void *)0x113b51;
      multi_thread_test();
    }
    pfVar18[-1].custom_cmp_param = (void *)0x113b5a;
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    pfVar18[-1].custom_cmp_param = (void *)0x113b63;
    fdb_close(_n_opened);
    pfVar18[-1].custom_cmp_param = (void *)0x113b68;
    fdb_shutdown();
    pfVar18[-1].custom_cmp_param = (void *)0x113b6d;
    memleak_end();
    pcVar35 = "%s PASSED\n";
    if (multi_thread_test(unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long)
        ::__test_pass != '\0') {
      pcVar35 = "%s FAILED\n";
    }
    pfVar18[-1].custom_cmp_param = (void *)0x113b9e;
    fprintf(_stderr,pcVar35,"multi thread test");
    return;
  }
  pfVar18[-1].custom_cmp_param = multi_thread_client_shutdown;
  multi_thread_test();
  pfVar18[-1].custom_cmp_param = &stack0xfffffffffffffff8;
  pfVar18[-1].custom_cmp = (fdb_custom_cmp_variable)fconfig_00;
  *(int **)(pfVar18 + -1) = &n_opened;
  pfVar18[-2].custom_cmp_param = &ts_cur.tv_usec;
  pfVar18[-2].custom_cmp = (fdb_custom_cmp_variable)ndocs;
  *(fdb_file_handle ***)(pfVar18 + -2) = &dbfile;
  pcVar38 = (code *)0x0;
  pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113bd7;
  gettimeofday((timeval *)&pfVar18[-4].custom_cmp,(__timezone_ptr_t)0x0);
  if (pfVar36 == (fdb_file_handle *)0x0) {
    pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113be5;
    memleak_start();
    pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113bf1;
    system("rm -rf  dummy* > errorlog.txt");
    *(undefined4 *)(pfVar18 + -0xe) = 0;
    do {
      *(undefined8 *)(pfVar18 + -0x10) = 0x113c2d;
      pthread_create((pthread_t *)(&pfVar18[-0xf].create_if_missing + (long)(int)pcVar38 * 8),
                     (pthread_attr_t *)0x0,multi_thread_client_shutdown,pfVar18 + -0xe);
      iVar8 = *(int *)(pfVar18 + -0xe);
      uVar22 = iVar8 + 1;
      pcVar38 = (code *)(ulong)uVar22;
      *(uint *)(pfVar18 + -0xe) = uVar22;
    } while (iVar8 < 1);
    *(undefined4 *)(pfVar18 + -0xe) = 0;
    iVar8 = 0;
    do {
      pVar2 = *(pthread_t *)(&pfVar18[-0xf].create_if_missing + (long)iVar8 * 8);
      *(undefined8 *)(pfVar18 + -0x10) = 0x113c5d;
      pthread_join(pVar2,(void **)((long)pfVar18 + ((long)iVar8 + -0x2f) * 8));
      iVar1 = *(int *)(pfVar18 + -0xe);
      iVar8 = iVar1 + 1;
      *(int *)(pfVar18 + -0xe) = iVar8;
    } while (iVar1 < 1);
    *(undefined8 *)(pfVar18 + -0x10) = 0x113c75;
    memleak_end();
    pcVar35 = "%s PASSED\n";
    if (multi_thread_client_shutdown(void*)::__test_pass != '\0') {
      pcVar35 = "%s FAILED\n";
    }
    *(undefined8 *)(pfVar18 + -0x10) = 0x113ca6;
    fprintf(_stderr,pcVar35,"multi thread client shutdown");
    return;
  }
  pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113cc6;
  fdb_get_default_config();
  pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113ccf;
  fdb_get_default_kvs_config();
  pfVar18[-0xe].custom_cmp_param = (void *)0x400;
  *(undefined1 *)((long)&pfVar18[-0xd].custom_cmp_param + 7) = 0;
  pfVar24 = pfVar18 + -3;
  pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113cee;
  fVar7 = fdb_open((fdb_file_handle **)pfVar24,"./dummy1",(fdb_config *)(pfVar18 + -0xe));
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pfVar36 = *(fdb_file_handle **)(pfVar18 + -3);
    pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113cfb;
    fVar7 = fdb_close(pfVar36);
    if (fVar7 != FDB_RESULT_SUCCESS) {
      pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113d08;
      multi_thread_client_shutdown();
    }
    pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113d0d;
    fdb_shutdown();
    pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)0x113d14;
    pthread_exit((void *)0x0);
  }
  pfVar18[-0xf].custom_cmp = multi_thread_kvs_client;
  multi_thread_client_shutdown();
  pp_Var29 = &pfVar18[-0xf].custom_cmp;
  pp_Var25 = &pfVar18[-0xf].custom_cmp;
  pp_Var30 = &pfVar18[-0xf].custom_cmp;
  pp_Var31 = &pfVar18[-0xf].custom_cmp;
  pp_Var32 = &pfVar18[-0xf].custom_cmp;
  pp_Var33 = &pfVar18[-0xf].custom_cmp;
  pp_Var34 = &pfVar18[-0xf].custom_cmp;
  pfVar18[-0xf].custom_cmp = (fdb_custom_cmp_variable)&pfVar18[-1].custom_cmp_param;
  *(fdb_config **)(pfVar18 + -0xf) = fconfig_00;
  pfVar18[-0x10].custom_cmp_param = &n_opened;
  pfVar18[-0x10].custom_cmp = (fdb_custom_cmp_variable)0x0;
  *(size_t *)(pfVar18 + -0x10) = ndocs;
  pfVar18[-0x11].custom_cmp_param = (fdb_config *)(pfVar18 + -0xe);
  pp_Var26 = &pfVar18[-0x65].custom_cmp;
  pfVar27 = (fdb_kvs_config *)&pfVar18[-0x65].custom_cmp;
  *(undefined8 *)(pfVar18 + -0x65) = 0x113d3e;
  gettimeofday((timeval *)&pfVar18[-0x15].custom_cmp,(__timezone_ptr_t)0x0);
  *(undefined8 *)(pfVar18 + -0x11) = 0;
  if (pfVar24 != (fdb_kvs_config *)0x0) {
    pfVar14 = (fdb_doc *)&pfVar18[-0x40].custom_cmp_param;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113d5e;
    fdb_get_default_config();
    fconfig_00 = (fdb_config *)&pfVar18[-0x54].custom_cmp;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113d75;
    memcpy(fconfig_00,pfVar14,0xf8);
    pfVar15 = (fdb_kvs_handle *)&pfVar18[-0x11].custom_cmp;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113d88;
    fVar7 = fdb_open((fdb_file_handle **)pfVar15,"./dummy1",fconfig_00);
    pfVar6 = (fdb_kvs_config *)&pfVar18[-0x65].custom_cmp;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142ce;
    uVar22 = *(uint *)pfVar24;
    pfVar24 = (fdb_kvs_config *)&pfVar18[-0x40].custom_cmp_param;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113daa;
    sprintf((char *)pfVar24,"db%d",(ulong)uVar22);
    pfVar14 = (fdb_doc *)&pfVar18[-0x20].custom_cmp_param;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113db9;
    fdb_get_default_kvs_config();
    pfVar19 = pfVar18 + -0x14;
    pfVar18[-0x14].custom_cmp_param = pfVar18[-0x1f].custom_cmp;
    *(void **)pfVar19 = *(void **)pfVar14;
    pfVar18[-0x14].custom_cmp = *(fdb_custom_cmp_variable *)(pfVar18 + -0x1f);
    pfVar15 = (fdb_kvs_handle *)pfVar18[-0x11].custom_cmp;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113ddc;
    fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar15,
                         (fdb_kvs_handle **)&pfVar18[-0x13].custom_cmp_param,(char *)pfVar24,pfVar19
                        );
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142d3;
    pfVar24 = (fdb_kvs_config *)0x0;
    fconfig_00 = (fdb_config *)0x0;
    do {
      *(undefined8 *)(pfVar18 + -0x65) = 0x113e04;
      sprintf((char *)&pfVar18[-0x20].custom_cmp_param,"key%d",(ulong)fconfig_00 & 0xffffffff);
      *(undefined8 *)(pfVar18 + -0x65) = 0x113e1f;
      sprintf((char *)&pfVar18[-0x35].custom_cmp,"meta%d",(ulong)fconfig_00 & 0xffffffff);
      *(undefined8 *)(pfVar18 + -0x65) = 0x113e37;
      sprintf(&pfVar18[-0x2a].create_if_missing,"body%d",(ulong)fconfig_00 & 0xffffffff);
      pcVar38 = (code *)((long)pfVar24 + (long)pfVar18 + -0x970);
      *(undefined8 *)(pfVar18 + -0x65) = 0x113e4a;
      pfVar14 = (fdb_doc *)strlen((char *)&pfVar18[-0x20].custom_cmp_param);
      *(undefined8 *)(pfVar18 + -0x65) = 0x113e55;
      ndocs = strlen((char *)&pfVar18[-0x35].custom_cmp);
      *(undefined8 *)(pfVar18 + -0x65) = 0x113e64;
      sVar10 = strlen(&pfVar18[-0x2a].create_if_missing);
      pfVar19 = (fdb_kvs_config *)&pfVar18[-0x35].custom_cmp;
      pfVar18[-0x66].custom_cmp_param = (void *)sVar10;
      pfVar18[-0x66].custom_cmp = (fdb_custom_cmp_variable)0x113e8c;
      fdb_doc_create((fdb_doc **)pcVar38,&pfVar18[-0x20].custom_cmp_param,(size_t)pfVar14,pfVar19,
                     ndocs,pfVar18 + -0x2a,(size_t)pfVar18[-0x66].custom_cmp_param);
      pfVar15 = (fdb_kvs_handle *)pfVar18[-0x13].custom_cmp_param;
      pfVar3 = (fdb_doc *)
               (&pfVar18->custom_cmp_param)[(long)&fconfig_00[-2].min_block_reuse_filesize];
      *(undefined8 *)(pfVar18 + -0x65) = 0x113ea1;
      fVar7 = fdb_set(pfVar15,pfVar3);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142b0;
      pfVar3 = (fdb_doc *)
               (&pfVar18->custom_cmp_param)[(long)&fconfig_00[-2].min_block_reuse_filesize];
      *(undefined8 *)(pfVar18 + -0x65) = 0x113eb6;
      fdb_doc_free(pfVar3);
      fconfig_00 = (fdb_config *)((long)&fconfig_00->chunksize + 1);
      pfVar24 = (fdb_kvs_config *)&pfVar24->custom_cmp;
    } while (fconfig_00 != (fdb_config *)0x32);
    pfVar15 = (fdb_kvs_handle *)pfVar18[-0x11].custom_cmp;
    *(undefined8 *)(pfVar18 + -0x65) = 0x113ed5;
    fVar7 = fdb_commit((fdb_file_handle *)pfVar15,'\x01');
    pfVar27 = (fdb_kvs_config *)&pfVar18[-0x65].custom_cmp;
    if (fVar7 == FDB_RESULT_SUCCESS) {
      pfVar36 = (fdb_file_handle *)pfVar18[-0x11].custom_cmp;
      *(undefined8 *)(pfVar18 + -0x65) = 0x113ee6;
      fdb_close(pfVar36);
      return;
    }
    goto LAB_001142dd;
  }
  *(undefined8 *)(pfVar18 + -0x65) = 0x113efc;
  memleak_start();
  *(undefined8 *)(pfVar18 + -0x65) = 0x113f08;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar24 = (fdb_kvs_config *)&pfVar18[-0x40].custom_cmp_param;
  *(undefined8 *)(pfVar18 + -0x65) = 0x113f17;
  fdb_get_default_config();
  pfVar14 = (fdb_doc *)&pfVar18[-0x54].custom_cmp;
  *(undefined8 *)(pfVar18 + -0x65) = 0x113f2e;
  memcpy(pfVar14,pfVar24,0xf8);
  pfVar18[-0x54].custom_cmp_param = (void *)0x0;
  *(undefined8 *)(pfVar18 + -0x53) = 0x400;
  pfVar18[-0x52].field_0x7 = 0;
  pfVar15 = (fdb_kvs_handle *)&pfVar18[-0x11].custom_cmp;
  *(undefined8 *)(pfVar18 + -0x65) = 0x113f56;
  fVar7 = fdb_open((fdb_file_handle **)pfVar15,"./dummy1",(fdb_config *)pfVar14);
  pfVar27 = (fdb_kvs_config *)&pfVar18[-0x65].custom_cmp;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142d8;
  pfVar18[-0x12].custom_cmp_param = &pfVar18[-0x6c].custom_cmp_param;
  pfVar27 = pfVar18 + -0x72;
  pfVar14 = (fdb_doc *)&pfVar18[-0x40].custom_cmp_param;
  pfVar24 = pfVar18 + -0x14;
  fconfig_00 = (fdb_config *)0x0;
  pcVar38 = (code *)0x0;
  do {
    pfVar18[-0x73].custom_cmp_param = (void *)0x113fa0;
    sprintf((char *)pfVar14,"db%d",(ulong)pcVar38 & 0xffffffff);
    pfVar18[-0x73].custom_cmp_param = (void *)0x113fac;
    fdb_get_default_kvs_config();
    pfVar18[-0x14].custom_cmp_param = pfVar18[-0x1f].custom_cmp;
    *(void **)(pfVar18 + -0x14) = pfVar18[-0x20].custom_cmp_param;
    pfVar18[-0x14].custom_cmp = *(fdb_custom_cmp_variable *)(pfVar18 + -0x1f);
    pfVar15 = (fdb_kvs_handle *)pfVar18[-0x11].custom_cmp;
    pfVar18[-0x73].custom_cmp_param = (void *)0x113fdc;
    pfVar19 = pfVar24;
    fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar15,
                         (fdb_kvs_handle **)((long)fconfig_00 + (long)pfVar18 + -0x690),
                         (char *)pfVar14,pfVar24);
    ndocs = (size_t)pfVar27;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142ba;
    pfVar15 = *(fdb_kvs_handle **)
               (&pfVar18->create_if_missing +
               (long)&((fdb_kvs_config *)((long)pcVar38 + -0xd8))->field_0x6 * 8);
    pfVar18[-0x73].custom_cmp_param = (void *)0x113ff1;
    fVar7 = fdb_kvs_close(pfVar15);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142b5;
    pcVar38 = (code *)&((fdb_kvs_config *)pcVar38)->field_0x1;
    fconfig_00 = (fdb_config *)&fconfig_00->buffercache_size;
  } while (pcVar38 != (code *)0x14);
  pfVar24 = (fdb_kvs_config *)&pfVar18[-0x4a].custom_cmp_param;
  lVar39 = 0;
  fconfig_00 = (fdb_config *)pfVar18[-0x12].custom_cmp_param;
  do {
    *(int *)pfVar24 = (int)lVar39;
    pfVar18[-0x73].custom_cmp_param = (void *)0x11402e;
    pfVar19 = pfVar24;
    pthread_create((pthread_t *)fconfig_00,(pthread_attr_t *)0x0,multi_thread_kvs_client,pfVar24);
    lVar39 = lVar39 + 1;
    fconfig_00 = (fdb_config *)((long)fconfig_00 + 8);
    pfVar24 = (fdb_kvs_config *)&pfVar24->field_0x4;
  } while (lVar39 != 0x14);
  lVar39 = 0;
  pfVar14 = (fdb_doc *)pfVar18[-0x12].custom_cmp_param;
  do {
    pVar2 = *(pthread_t *)((long)&pfVar14->keylen + lVar39);
    pfVar18[-0x73].custom_cmp_param = (void *)0x114052;
    pthread_join(pVar2,(void **)(&pfVar27->create_if_missing + lVar39));
    lVar39 = lVar39 + 8;
  } while (lVar39 != 0xa0);
  pfVar15 = (fdb_kvs_handle *)pfVar18[-0x11].custom_cmp;
  pfVar18[-0x73].custom_cmp_param = (void *)0x11406a;
  fVar7 = fdb_commit((fdb_file_handle *)pfVar15,'\0');
  pcVar38 = (code *)0x14;
  pfVar24 = (fdb_kvs_config *)0xa0;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142e2;
  ndocs = (size_t)&pfVar18[-0x20].custom_cmp_param;
  pfVar14 = (fdb_doc *)0x0;
  do {
    pfVar24 = (fdb_kvs_config *)&pfVar18[-0x40].custom_cmp_param;
    pfVar18[-0x73].custom_cmp_param = (void *)0x114097;
    sprintf((char *)pfVar24,"db%d",(ulong)pfVar14 & 0xffffffff);
    pfVar18[-0x73].custom_cmp_param = (void *)0x1140a0;
    fdb_get_default_kvs_config();
    pfVar18[-0x14].custom_cmp_param = pfVar18[-0x12].custom_cmp;
    *(void **)(pfVar18 + -0x14) = pfVar18[-0x13].custom_cmp_param;
    pfVar18[-0x14].custom_cmp = *(fdb_custom_cmp_variable *)(pfVar18 + -0x12);
    pfVar15 = (fdb_kvs_handle *)pfVar18[-0x11].custom_cmp;
    fconfig_00 = (fdb_config *)(&pfVar18[-0x46].create_if_missing + (long)pfVar14 * 8);
    pfVar19 = pfVar18 + -0x14;
    pfVar18[-0x73].custom_cmp_param = (void *)0x1140cb;
    fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar15,(fdb_kvs_handle **)fconfig_00,(char *)pfVar24,
                         pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142bf;
    pfVar15 = *(fdb_kvs_handle **)fconfig_00;
    pfVar18[-0x73].custom_cmp_param = (void *)0x1140df;
    fVar7 = fdb_get_kvs_seqnum(pfVar15,(fdb_seqnum_t *)&pfVar18[-0x13].custom_cmp);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142c4;
    pfVar18[-0x12].custom_cmp_param = pfVar14;
    if (pfVar18[-0x13].custom_cmp != (fdb_custom_cmp_variable)0x32) {
      pfVar18[-0x73].custom_cmp_param = (void *)0x114259;
      multi_thread_kvs_client();
    }
    pcVar38 = (code *)0x0;
    do {
      pfVar18[-0x73].custom_cmp_param = (void *)0x11410d;
      sprintf((char *)ndocs,"key%d",pcVar38);
      pfVar18[-0x73].custom_cmp_param = (void *)0x114125;
      sprintf((char *)&pfVar18[-0x35].custom_cmp,"meta%d",pcVar38);
      pfVar18[-0x73].custom_cmp_param = (void *)0x11413d;
      sprintf(&pfVar18[-0x2a].create_if_missing,"body%d",pcVar38);
      pfVar18[-0x73].custom_cmp_param = (void *)0x114145;
      sVar10 = strlen((char *)ndocs);
      pfVar19 = (fdb_kvs_config *)0x0;
      pfVar18[-0x73].custom_cmp = (fdb_custom_cmp_variable)0x0;
      *(undefined8 *)(pfVar18 + -0x73) = 0x114162;
      fdb_doc_create((fdb_doc **)(pfVar18 + -0x11),(void *)ndocs,sVar10,(void *)0x0,0,(void *)0x0,
                     (size_t)pfVar18[-0x73].custom_cmp);
      pfVar15 = *(fdb_kvs_handle **)fconfig_00;
      pfVar3 = *(fdb_doc **)(pfVar18 + -0x11);
      pfVar18[-0x73].custom_cmp_param = (void *)0x114172;
      fVar7 = fdb_get(pfVar15,pfVar3);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        pfVar18[-0x73].custom_cmp_param = (void *)0x1142b0;
        multi_thread_kvs_client();
        goto LAB_001142b0;
      }
      pfVar14 = *(fdb_doc **)(pfVar18 + -0x11);
      pfVar24 = (fdb_kvs_config *)pfVar14->key;
      pfVar18[-0x73].custom_cmp_param = (void *)0x11418a;
      sVar10 = strlen((char *)ndocs);
      pfVar18[-0x73].custom_cmp_param = (void *)0x114198;
      iVar8 = bcmp(pfVar24,(void *)ndocs,sVar10);
      if (iVar8 != 0) {
        pfVar18[-0x73].custom_cmp_param = (void *)0x1141f3;
        multi_thread_kvs_client();
        pfVar14 = (fdb_doc *)pfVar18[-0x13].custom_cmp_param;
      }
      sVar10 = pfVar14->metalen;
      pvVar20 = pfVar14->meta;
      pfVar18[-0x73].custom_cmp_param = (void *)0x1141b0;
      iVar8 = bcmp(pvVar20,&pfVar18[-0x35].custom_cmp,sVar10);
      if (iVar8 != 0) {
        pfVar18[-0x73].custom_cmp_param = (void *)0x11420d;
        multi_thread_kvs_client();
        pfVar14 = (fdb_doc *)pfVar18[-0x13].custom_cmp_param;
      }
      sVar10 = pfVar14->bodylen;
      pvVar20 = pfVar14->body;
      pfVar18[-0x73].custom_cmp_param = (void *)0x1141c8;
      iVar8 = bcmp(pvVar20,pfVar18 + -0x2a,sVar10);
      if (iVar8 != 0) {
        pfVar18[-0x73].custom_cmp_param = (void *)0x114227;
        multi_thread_kvs_client();
        pfVar14 = (fdb_doc *)pfVar18[-0x13].custom_cmp_param;
      }
      pfVar18[-0x73].custom_cmp_param = (void *)0x1141d4;
      fdb_doc_free(pfVar14);
      uVar22 = (int)pcVar38 + 1;
      pcVar38 = (code *)(ulong)uVar22;
    } while (uVar22 != 0x32);
    pfVar15 = *(fdb_kvs_handle **)fconfig_00;
    pfVar18[-0x73].custom_cmp_param = (void *)0x114235;
    fVar7 = fdb_kvs_close(pfVar15);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001142c9;
    pfVar14 = (fdb_doc *)((long)pfVar18[-0x12].custom_cmp_param + 1);
  } while (pfVar14 != (fdb_doc *)0x14);
  pfVar15 = (fdb_kvs_handle *)pfVar18[-0x11].custom_cmp;
  pfVar18[-0x73].custom_cmp_param = (void *)0x114267;
  fVar7 = fdb_close((fdb_file_handle *)pfVar15);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pfVar18[-0x73].custom_cmp_param = (void *)0x114270;
    fdb_shutdown();
    pfVar18[-0x73].custom_cmp_param = (void *)0x114275;
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      pcVar35 = "%s PASSED\n";
    }
    else {
      pcVar35 = "%s FAILED\n";
    }
    pfVar18[-0x73].custom_cmp_param = (void *)0x1142a6;
    fprintf(_stderr,pcVar35,"multi thread kvs client");
    return;
  }
  goto LAB_001142e7;
LAB_001146d9:
  *(undefined8 *)(pfVar27 + -0x10) = 0x1146de;
  multi_thread_fhandle_share();
LAB_001146de:
  *(undefined8 *)(pfVar27 + -0x10) = 0x1146e3;
  multi_thread_fhandle_share();
LAB_001146e3:
  *(undefined8 *)(pfVar27 + -0x10) = 0x1146e8;
  multi_thread_fhandle_share();
LAB_001146e8:
  ppvVar17 = &pfVar27[-0xf].custom_cmp_param;
  pcVar35 = "key%03d";
  *(undefined8 *)(pfVar27 + -0x10) = 0x1146ed;
  multi_thread_fhandle_share();
  goto LAB_001146ed;
LAB_00114e32:
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e37;
  custom_compare_primitive_test();
LAB_00114e37:
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e3c;
  custom_compare_primitive_test();
LAB_00114e3c:
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e41;
  custom_compare_primitive_test();
  goto LAB_00114e41;
LAB_001142b0:
  pfVar27[-1].custom_cmp_param = (void *)0x1142b5;
  multi_thread_kvs_client();
LAB_001142b5:
  pfVar27[-1].custom_cmp_param = (void *)0x1142ba;
  multi_thread_kvs_client();
LAB_001142ba:
  pfVar27[-1].custom_cmp_param = (void *)0x1142bf;
  multi_thread_kvs_client();
LAB_001142bf:
  pfVar27[-1].custom_cmp_param = (void *)0x1142c4;
  multi_thread_kvs_client();
LAB_001142c4:
  pfVar27[-1].custom_cmp_param = (void *)0x1142c9;
  multi_thread_kvs_client();
LAB_001142c9:
  pfVar27[-1].custom_cmp_param = (void *)0x1142ce;
  multi_thread_kvs_client();
  pfVar6 = pfVar27;
LAB_001142ce:
  pp_Var26 = (fdb_custom_cmp_variable *)pfVar6;
  *(undefined8 *)((long)pp_Var26 + -8) = 0x1142d3;
  multi_thread_kvs_client();
LAB_001142d3:
  *(undefined8 *)((long)pp_Var26 + -8) = 0x1142d8;
  multi_thread_kvs_client();
  pfVar27 = (fdb_kvs_config *)pp_Var26;
LAB_001142d8:
  *(undefined8 *)((long)pfVar27 + -8) = 0x1142dd;
  multi_thread_kvs_client();
LAB_001142dd:
  *(undefined8 *)((long)pfVar27 + -8) = 0x1142e2;
  multi_thread_kvs_client();
LAB_001142e2:
  pfVar27[-1].custom_cmp_param = (void *)0x1142e7;
  multi_thread_kvs_client();
LAB_001142e7:
  pfVar27[-1].custom_cmp_param = multi_thread_fhandle_share;
  multi_thread_kvs_client();
  pfVar27[-1].custom_cmp_param = &pfVar18[-0xf].custom_cmp;
  pfVar27[-1].custom_cmp = (fdb_custom_cmp_variable)fconfig_00;
  *(fdb_doc **)(pfVar27 + -1) = pfVar14;
  pfVar27[-2].custom_cmp_param = pcVar38;
  pfVar27[-2].custom_cmp = (fdb_custom_cmp_variable)ndocs;
  *(fdb_kvs_config **)(pfVar27 + -2) = pfVar24;
  *(undefined8 *)(pfVar27 + -0x10) = 0x11430c;
  gettimeofday((timeval *)(pfVar27 + -0xd),(__timezone_ptr_t)0x0);
  if (pfVar15 != (fdb_kvs_handle *)0x0) {
    if (*(char *)&pfVar15->op_stats == '\0') {
      if (((ulong)pfVar15->op_stats & 0x100) == 0) {
        ppvVar17 = &pfVar27[-0xf].custom_cmp_param;
        ndocs = (size_t)&pfVar27[-0xd].custom_cmp_param;
        pcVar38 = (code *)&pfVar27[-0x10].custom_cmp_param;
        pp_Var29 = (fdb_custom_cmp_variable *)0x0;
        do {
          pfVar27[-0xd].custom_cmp_param = (void *)0x0;
          *(undefined8 *)(pfVar27 + -0x10) = 0x1143fa;
          sprintf((char *)ppvVar17,"key%03d",pp_Var29);
          pfVar4 = (fdb_kvs_handle *)(pfVar15->kvs_config).custom_cmp_param;
          *(undefined8 *)(pfVar27 + -0x10) = 0x114411;
          pfVar19 = (fdb_kvs_config *)ndocs;
          fVar7 = fdb_get_kv(pfVar4,ppvVar17,7,(void **)ndocs,(size_t *)pcVar38);
          if (fVar7 == FDB_RESULT_HANDLE_BUSY) {
            *(undefined8 *)(pfVar27 + -0x10) = 0x1146cf;
            multi_thread_fhandle_share();
LAB_001146cf:
            *(undefined8 *)(pfVar27 + -0x10) = 0x1146d4;
            multi_thread_fhandle_share();
LAB_001146d4:
            *(undefined8 *)(pfVar27 + -0x10) = 0x1146d9;
            multi_thread_fhandle_share();
            goto LAB_001146d9;
          }
          pfVar4 = (fdb_kvs_handle *)pfVar15->kvs;
          *(undefined8 *)(pfVar27 + -0x10) = 0x114431;
          pfVar19 = (fdb_kvs_config *)ndocs;
          fVar7 = fdb_get_kv(pfVar4,ppvVar17,7,(void **)ndocs,(size_t *)pcVar38);
          if (fVar7 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146cf;
          pfVar4 = (fdb_kvs_handle *)(pfVar15->kvs_config).custom_cmp;
          *(undefined8 *)(pfVar27 + -0x10) = 0x114451;
          pfVar19 = (fdb_kvs_config *)ndocs;
          fVar7 = fdb_get_kv(pfVar4,ppvVar17,7,(void **)ndocs,(size_t *)pcVar38);
          if (fVar7 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146d4;
          uVar22 = (int)pp_Var29 + 1;
          pp_Var29 = (fdb_custom_cmp_variable *)(ulong)uVar22;
        } while ((uVar22 != 2000) ||
                (pp_Var29 = (fdb_custom_cmp_variable *)0x0, ((ulong)pfVar15->op_stats & 0x100) == 0)
                );
      }
    }
    else {
      ppvVar17 = &pfVar27[-0xf].custom_cmp_param;
      pp_Var29 = (fdb_custom_cmp_variable *)0x0;
      do {
        *(undefined8 *)(pfVar27 + -0x10) = 0x11433c;
        sprintf((char *)ppvVar17,"key%03d",pp_Var29);
        pfVar4 = (fdb_kvs_handle *)(pfVar15->kvs_config).custom_cmp_param;
        pfVar19 = (fdb_kvs_config *)0x0;
        *(undefined8 *)(pfVar27 + -0x10) = 0x114352;
        fVar7 = fdb_set_kv(pfVar4,ppvVar17,7,(void *)0x0,0);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146e8;
        pfVar4 = (fdb_kvs_handle *)pfVar15->kvs;
        pfVar19 = (fdb_kvs_config *)0x0;
        *(undefined8 *)(pfVar27 + -0x10) = 0x114370;
        fVar7 = fdb_set_kv(pfVar4,ppvVar17,7,(void *)0x0,0);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146e3;
        pfVar4 = (fdb_kvs_handle *)(pfVar15->kvs_config).custom_cmp;
        pfVar19 = (fdb_kvs_config *)0x0;
        *(undefined8 *)(pfVar27 + -0x10) = 0x11438e;
        fVar7 = fdb_set_kv(pfVar4,ppvVar17,7,(void *)0x0,0);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146de;
        pfVar4 = *(fdb_kvs_handle **)&pfVar15->kvs_config;
        *(undefined8 *)(pfVar27 + -0x10) = 0x1143a3;
        fVar7 = fdb_commit((fdb_file_handle *)pfVar4,'\x01');
        if (fVar7 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146d9;
        uVar22 = (int)pp_Var29 + 1;
        pp_Var29 = (fdb_custom_cmp_variable *)(ulong)uVar22;
      } while (uVar22 != 2000);
    }
    return;
  }
  *(undefined8 *)(pfVar27 + -0x10) = 0x114487;
  pfVar15 = (fdb_kvs_handle *)malloc(0x10);
  *(undefined8 *)(pfVar27 + -0x10) = 0x114494;
  pcVar35 = (char *)malloc(0x50);
  *(undefined8 *)(pfVar27 + -0x10) = 0x1144a1;
  ppvVar17 = (void **)malloc(0x10);
  *(undefined8 *)(pfVar27 + -0x10) = 0x1144b0;
  system("rm -rf  func_test* > errorlog.txt");
  ndocs = (size_t)&pfVar27[-0xd].custom_cmp_param;
  *(undefined8 *)(pfVar27 + -0x10) = 0x1144bd;
  fdb_get_default_config();
  *(undefined8 *)(pfVar27 + -0xc) = 0;
  *(undefined1 *)((long)&pfVar27[-0xb].custom_cmp + 7) = 0;
  pfVar27[-8].custom_cmp_param = (void *)0x1;
  *(undefined8 *)(pfVar27 + -0x10) = 0x1144df;
  fdb_get_default_kvs_config();
  pcVar38 = (code *)&pfVar27[-0xf].custom_cmp_param;
  *(undefined8 *)(pfVar27 + -0x10) = 0x1144f7;
  sprintf((char *)pcVar38,"./func_test_pt.%d",0);
  *(undefined8 *)(pfVar27 + -0x10) = 0x114505;
  fVar7 = fdb_open((fdb_file_handle **)&pfVar27[-0x10].custom_cmp,(char *)pcVar38,
                   (fdb_config *)ndocs);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pfVar36 = (fdb_file_handle *)pfVar27[-0x10].custom_cmp;
    *(fdb_file_handle **)pcVar35 = pfVar36;
    *(fdb_file_handle **)(pcVar35 + 0x28) = pfVar36;
    pcVar35[0x20] = '\x01';
    pcVar35[0x48] = '\0';
    *(undefined8 *)(pfVar27 + -0x10) = 0x114530;
    fVar7 = fdb_kvs_open_default
                      (pfVar36,(fdb_kvs_handle **)(pcVar35 + 0x30),
                       (fdb_kvs_config *)&pfVar27[-0x10].custom_cmp_param);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146f2;
    pfVar36 = (fdb_file_handle *)pfVar27[-0x10].custom_cmp;
    pfVar19 = (fdb_kvs_config *)&pfVar27[-0x10].custom_cmp_param;
    *(undefined8 *)(pfVar27 + -0x10) = 0x114551;
    fVar7 = fdb_kvs_open(pfVar36,(fdb_kvs_handle **)(pcVar35 + 0x38),"main",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146f7;
    pfVar36 = (fdb_file_handle *)pfVar27[-0x10].custom_cmp;
    pfVar19 = (fdb_kvs_config *)&pfVar27[-0x10].custom_cmp_param;
    *(undefined8 *)(pfVar27 + -0x10) = 0x114572;
    fVar7 = fdb_kvs_open(pfVar36,(fdb_kvs_handle **)(pcVar35 + 0x40),"back",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001146fc;
    pfVar36 = (fdb_file_handle *)pfVar27[-0x10].custom_cmp;
    *(undefined8 *)(pfVar27 + -0x10) = 0x11458c;
    fVar7 = fdb_kvs_open_default
                      (pfVar36,(fdb_kvs_handle **)(pcVar35 + 8),
                       (fdb_kvs_config *)&pfVar27[-0x10].custom_cmp_param);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114701;
    pfVar36 = (fdb_file_handle *)pfVar27[-0x10].custom_cmp;
    pfVar19 = (fdb_kvs_config *)&pfVar27[-0x10].custom_cmp_param;
    *(undefined8 *)(pfVar27 + -0x10) = 0x1145ad;
    fVar7 = fdb_kvs_open(pfVar36,(fdb_kvs_handle **)(pcVar35 + 0x10),"main",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114706;
    pfVar36 = (fdb_file_handle *)pfVar27[-0x10].custom_cmp;
    pfVar19 = (fdb_kvs_config *)&pfVar27[-0x10].custom_cmp_param;
    *(undefined8 *)(pfVar27 + -0x10) = 0x1145ce;
    fVar7 = fdb_kvs_open(pfVar36,(fdb_kvs_handle **)(pcVar35 + 0x18),"back",pfVar19);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011470b;
    *(undefined8 *)(pfVar27 + -0x10) = 0x1145ee;
    printf("Creating %d writers+readers over %d docs..\n",1,2000);
    ndocs = (size_t)(pcVar35 + 0x28);
    lVar39 = 8;
    pcVar38 = multi_thread_fhandle_share;
    do {
      LOCK();
      *(undefined1 *)((long)&((fdb_kvs_config *)(ndocs + 0x18))->custom_cmp + 1) = 0;
      UNLOCK();
      *(undefined8 *)(pfVar27 + -0x10) = 0x114619;
      pfVar19 = (fdb_kvs_config *)ndocs;
      pthread_create((pthread_t *)((long)&(pfVar15->kvs_config).create_if_missing + lVar39),
                     (pthread_attr_t *)0x0,multi_thread_fhandle_share,(void *)ndocs);
      lVar39 = lVar39 + -8;
      ndocs = (size_t)&((fdb_kvs_config *)(ndocs + -0x30))->custom_cmp;
    } while (lVar39 != -8);
    pfVar4 = *(fdb_kvs_handle **)&pfVar15->kvs_config;
    *(undefined8 *)(pfVar27 + -0x10) = 0x114632;
    pthread_join((pthread_t)pfVar4,ppvVar17);
    *(undefined8 *)(pfVar27 + -0x10) = 0x114642;
    printf("Writer %d done\n",0);
    LOCK();
    pcVar35[0x49] = '\x01';
    UNLOCK();
    __th = (list *)(pfVar15->kvs_config).custom_cmp;
    *(undefined8 *)(pfVar27 + -0x10) = 0x114658;
    pthread_join((pthread_t)__th,ppvVar17 + 1);
    pfVar36 = *(fdb_file_handle **)pcVar35;
    *(undefined8 *)(pfVar27 + -0x10) = 0x114660;
    fVar7 = fdb_close(pfVar36);
    pp_Var34 = (fdb_custom_cmp_variable *)0xfffffffffffffff8;
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined8 *)(pfVar27 + -0x10) = 0x114670;
      free(pfVar15);
      *(undefined8 *)(pfVar27 + -0x10) = 0x114678;
      free(pcVar35);
      *(undefined8 *)(pfVar27 + -0x10) = 0x114680;
      free(ppvVar17);
      *(undefined8 *)(pfVar27 + -0x10) = 0x114685;
      fdb_shutdown();
      pcVar35 = "%s PASSED\n";
      if (multi_thread_fhandle_share(void*)::__test_pass != '\0') {
        pcVar35 = "%s FAILED\n";
      }
      *(undefined8 *)(pfVar27 + -0x10) = 0x1146b6;
      fprintf(_stderr,pcVar35,"multi thread file handle share test");
      return;
    }
  }
  else {
LAB_001146ed:
    *(undefined8 *)(pfVar27 + -0x10) = 0x1146f2;
    multi_thread_fhandle_share();
    pp_Var25 = pp_Var29;
LAB_001146f2:
    *(undefined8 *)(pfVar27 + -0x10) = 0x1146f7;
    multi_thread_fhandle_share();
    pp_Var30 = pp_Var25;
LAB_001146f7:
    *(undefined8 *)(pfVar27 + -0x10) = 0x1146fc;
    multi_thread_fhandle_share();
    pp_Var31 = pp_Var30;
LAB_001146fc:
    *(undefined8 *)(pfVar27 + -0x10) = 0x114701;
    multi_thread_fhandle_share();
    pp_Var32 = pp_Var31;
LAB_00114701:
    *(undefined8 *)(pfVar27 + -0x10) = 0x114706;
    multi_thread_fhandle_share();
    pp_Var33 = pp_Var32;
LAB_00114706:
    *(undefined8 *)(pfVar27 + -0x10) = 0x11470b;
    multi_thread_fhandle_share();
    pp_Var34 = pp_Var33;
LAB_0011470b:
    *(undefined8 *)(pfVar27 + -0x10) = 0x114710;
    multi_thread_fhandle_share();
  }
  *(code **)(pfVar27 + -0x10) = incomplete_block_test;
  multi_thread_fhandle_share();
  *(fdb_custom_cmp_variable **)(pfVar27 + -0x10) = pp_Var34;
  pfVar27[-0x11].custom_cmp_param = ppvVar17;
  pfVar27[-0x11].custom_cmp = (fdb_custom_cmp_variable)pcVar35;
  *(code **)(pfVar27 + -0x11) = pcVar38;
  pfVar27[-0x12].custom_cmp_param = (void *)ndocs;
  pfVar27[-0x12].custom_cmp = (fdb_custom_cmp_variable)pfVar15;
  *(undefined8 *)(pfVar27 + -0x41) = 0x114735;
  gettimeofday((timeval *)(pfVar27 + -0x3e),(__timezone_ptr_t)0x0);
  *(undefined8 *)(pfVar27 + -0x41) = 0x11473a;
  memleak_start();
  *(undefined8 *)(pfVar27 + -0x40) = 0;
  *(undefined8 *)(pfVar27 + -0x41) = 0x11474b;
  system("rm -rf  dummy* > errorlog.txt");
  *(undefined8 *)(pfVar27 + -0x41) = 0x114758;
  fdb_get_default_config();
  pfVar18 = (fdb_kvs_config *)&pfVar27[-0x3e].custom_cmp_param;
  *(undefined8 *)(pfVar27 + -0x41) = 0x114765;
  fdb_get_default_kvs_config();
  *(undefined8 *)(pfVar27 + -0x3c) = 0;
  pfVar27[-0x3c].custom_cmp = (fdb_custom_cmp_variable)0x400;
  *(undefined4 *)&pfVar27[-0x3b].field_0x4 = 1;
  *(undefined1 *)((long)&pfVar27[-0x3b].custom_cmp + 7) = 0;
  pfVar24 = (fdb_kvs_config *)&pfVar27[-0x3f].custom_cmp_param;
  *(undefined8 *)(pfVar27 + -0x41) = 0x114793;
  fdb_open((fdb_file_handle **)pfVar24,"./dummy1",(fdb_config *)&pfVar27[-0x3d].custom_cmp_param);
  pfVar36 = *(fdb_file_handle **)pfVar24;
  pp_Var25 = &pfVar27[-0x40].custom_cmp;
  *(undefined8 *)(pfVar27 + -0x41) = 0x1147a6;
  fdb_kvs_open_default(pfVar36,(fdb_kvs_handle **)pp_Var25,pfVar18);
  pfVar15 = (fdb_kvs_handle *)*pp_Var25;
  *(undefined8 *)(pfVar27 + -0x41) = 0x1147bc;
  fVar7 = fdb_set_log_callback(pfVar15,logCallbackFunc,"incomplete_block_test");
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pp_Var25 = &pfVar27[-0x1d].custom_cmp;
    *(undefined8 *)(pfVar27 + -0x41) = 0x1147df;
    sprintf((char *)pp_Var25,"key%d",0);
    ndocs = (size_t)&pfVar27[-0x28].custom_cmp_param;
    *(undefined8 *)(pfVar27 + -0x41) = 0x1147fa;
    sprintf((char *)ndocs,"meta%d",0);
    pcVar38 = (code *)(pfVar27 + -0x32);
    *(undefined8 *)(pfVar27 + -0x41) = 0x114815;
    sprintf((char *)pcVar38,"body%d",0);
    *(undefined8 *)(pfVar27 + -0x41) = 0x11481d;
    sVar10 = strlen((char *)pp_Var25);
    *(undefined8 *)(pfVar27 + -0x41) = 0x114828;
    sVar11 = strlen((char *)ndocs);
    *(undefined8 *)(pfVar27 + -0x41) = 0x114833;
    sVar12 = strlen((char *)pcVar38);
    pfVar27[-0x41].custom_cmp = (fdb_custom_cmp_variable)sVar12;
    pfVar18 = (fdb_kvs_config *)&pfVar27[-0x40].custom_cmp_param;
    *(undefined8 *)(pfVar27 + -0x41) = 0x114853;
    fdb_doc_create((fdb_doc **)pfVar18,pp_Var25,sVar10,(void *)ndocs,sVar11,pcVar38,
                   (size_t)pfVar27[-0x41].custom_cmp);
    pfVar15 = (fdb_kvs_handle *)pfVar27[-0x40].custom_cmp;
    pfVar14 = *(fdb_doc **)pfVar18;
    *(undefined8 *)(pfVar27 + -0x41) = 0x114860;
    fdb_set(pfVar15,pfVar14);
    *(undefined8 *)(pfVar27 + -0x41) = 0x114876;
    sprintf((char *)pp_Var25,"key%d",1);
    *(undefined8 *)(pfVar27 + -0x41) = 0x11488c;
    sprintf((char *)ndocs,"meta%d",1);
    *(undefined8 *)(pfVar27 + -0x41) = 0x1148a2;
    sprintf((char *)pcVar38,"body%d",1);
    *(undefined8 *)(pfVar27 + -0x41) = 0x1148aa;
    sVar10 = strlen((char *)pp_Var25);
    *(undefined8 *)(pfVar27 + -0x41) = 0x1148b5;
    sVar11 = strlen((char *)ndocs);
    *(undefined8 *)(pfVar27 + -0x41) = 0x1148c0;
    sVar12 = strlen((char *)pcVar38);
    pfVar27[-0x41].custom_cmp = (fdb_custom_cmp_variable)sVar12;
    *(undefined8 *)(pfVar27 + -0x41) = 0x1148dd;
    fdb_doc_create((fdb_doc **)(pfVar27 + -0x3f),pp_Var25,sVar10,(void *)ndocs,sVar11,pcVar38,
                   (size_t)pfVar27[-0x41].custom_cmp);
    pfVar15 = (fdb_kvs_handle *)pfVar27[-0x40].custom_cmp;
    *(undefined8 *)(pfVar27 + -0x41) = 0x1148eb;
    fdb_set(pfVar15,*(fdb_doc **)(pfVar27 + -0x3f));
    pp_Var34 = (fdb_custom_cmp_variable *)CONCAT71((int7)(sVar11 >> 8),1);
    pfVar24 = pfVar27 + -0x40;
    while( true ) {
      sVar23 = **(size_t **)pfVar18;
      pvVar20 = (void *)(*(size_t **)pfVar18)[4];
      pfVar27[-0x41].custom_cmp = (fdb_custom_cmp_variable)0x0;
      pfVar19 = (fdb_kvs_config *)0x0;
      *(undefined8 *)(pfVar27 + -0x41) = 0x114915;
      fdb_doc_create((fdb_doc **)pfVar24,pvVar20,sVar23,(void *)0x0,0,(void *)0x0,
                     (size_t)pfVar27[-0x41].custom_cmp);
      pfVar15 = (fdb_kvs_handle *)pfVar27[-0x40].custom_cmp;
      *(undefined8 *)(pfVar27 + -0x41) = 0x114924;
      fVar7 = fdb_get(pfVar15,*(fdb_doc **)(pfVar27 + -0x40));
      if (fVar7 != FDB_RESULT_SUCCESS) break;
      ndocs = *(size_t *)(pfVar27 + -0x40);
      sVar10 = ((fdb_doc *)ndocs)->metalen;
      pcVar38 = (code *)((fdb_doc *)ndocs)->meta;
      pp_Var25 = *(fdb_custom_cmp_variable **)pfVar18;
      pfVar18 = (fdb_kvs_config *)pp_Var25[7];
      *(undefined8 *)(pfVar27 + -0x41) = 0x11494d;
      iVar8 = bcmp(pcVar38,pfVar18,sVar10);
      if (iVar8 != 0) goto LAB_00114a15;
      sVar10 = ((fdb_doc *)ndocs)->bodylen;
      pfVar18 = (fdb_kvs_config *)((fdb_doc *)ndocs)->body;
      pcVar38 = pp_Var25[8];
      *(undefined8 *)(pfVar27 + -0x41) = 0x11496e;
      iVar8 = bcmp(pfVar18,pcVar38,sVar10);
      if (iVar8 != 0) goto LAB_00114a20;
      *(undefined8 *)(pfVar27 + -0x41) = 0x11497e;
      fdb_doc_free((fdb_doc *)ndocs);
      *(undefined8 *)(pfVar27 + -0x40) = 0;
      pfVar18 = pfVar27 + -0x3f;
      cVar28 = (char)pp_Var34;
      pp_Var34 = (fdb_custom_cmp_variable *)0x0;
      if (cVar28 == '\0') {
        pfVar15 = (fdb_kvs_handle *)pfVar27[-0x40].custom_cmp;
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149a5;
        fdb_kvs_close(pfVar15);
        pfVar36 = (fdb_file_handle *)pfVar27[-0x3f].custom_cmp_param;
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149af;
        fdb_close(pfVar36);
        pfVar14 = (fdb_doc *)pfVar27[-0x40].custom_cmp_param;
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149b9;
        fdb_doc_free(pfVar14);
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149c3;
        fdb_doc_free(*(fdb_doc **)(pfVar27 + -0x3f));
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149c8;
        fdb_shutdown();
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149cd;
        memleak_end();
        pcVar35 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar35 = "%s FAILED\n";
        }
        *(undefined8 *)(pfVar27 + -0x41) = 0x1149fe;
        fprintf(_stderr,pcVar35,"incomplete block test");
        return;
      }
    }
    *(undefined8 *)(pfVar27 + -0x41) = 0x114a15;
    incomplete_block_test();
LAB_00114a15:
    *(undefined8 *)(pfVar27 + -0x41) = 0x114a20;
    incomplete_block_test();
LAB_00114a20:
    *(undefined8 *)(pfVar27 + -0x41) = 0x114a2b;
    incomplete_block_test();
  }
  *(code **)(pfVar27 + -0x41) = custom_compare_primitive_test;
  incomplete_block_test();
  *(fdb_custom_cmp_variable **)(pfVar27 + -0x41) = pp_Var34;
  pfVar27[-0x42].custom_cmp_param = pfVar24;
  pfVar27[-0x42].custom_cmp = (fdb_custom_cmp_variable)pfVar18;
  *(code **)(pfVar27 + -0x42) = pcVar38;
  pfVar27[-0x43].custom_cmp_param = (void *)ndocs;
  pfVar27[-0x43].custom_cmp = (fdb_custom_cmp_variable)pp_Var25;
  uVar9 = 0;
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114a4f;
  gettimeofday((timeval *)(pfVar27 + -0x68),(__timezone_ptr_t)0x0);
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114a54;
  memleak_start();
  pfVar27[-0x6a].custom_cmp_param = (void *)0x0;
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114a65;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114a75;
  fdb_get_default_config();
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114a82;
  fdb_get_default_kvs_config();
  pfVar27[-0x58].custom_cmp = (fdb_custom_cmp_variable)0x0;
  pfVar27[-0x58].custom_cmp_param = (void *)0x400;
  *(undefined4 *)((long)&pfVar27[-0x57].custom_cmp + 4) = 1;
  *(undefined1 *)((long)&pfVar27[-0x57].custom_cmp_param + 7) = 0;
  *(undefined1 *)&pfVar27[-0x56].custom_cmp_param = 1;
  *(code **)(pfVar27 + -0x67) = _cmp_double;
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114ac2;
  fdb_open((fdb_file_handle **)&pfVar27[-0x69].custom_cmp_param,"./dummy1",
           (fdb_config *)(pfVar27 + -0x58));
  pfVar36 = (fdb_file_handle *)pfVar27[-0x69].custom_cmp_param;
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114ad6;
  fdb_kvs_open_default
            (pfVar36,(fdb_kvs_handle **)&pfVar27[-0x69].custom_cmp,
             (fdb_kvs_config *)&pfVar27[-0x68].custom_cmp_param);
  pcVar38 = logCallbackFunc;
  pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114aec;
  fVar7 = fdb_set_log_callback
                    ((fdb_kvs_handle *)pfVar27[-0x69].custom_cmp,logCallbackFunc,
                     "custom_compare_primitive_test");
  if (fVar7 == FDB_RESULT_SUCCESS) {
    ppvVar17 = &pfVar27[-0x67].custom_cmp_param;
    pp_Var34 = &pfVar27[-0x4e].custom_cmp;
    lVar39 = 0;
    do {
      dVar42 = 10000.0 / (double)(int)lVar39;
      *(double *)(pfVar27 + -99) = dVar42;
      *(double *)(pfVar27 + -0x6a) = dVar42;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114b47;
      sprintf((char *)pp_Var34,"value: %d, %f",SUB84(dVar42,0),uVar9);
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114b4f;
      sVar10 = strlen((char *)pp_Var34);
      pfVar27[-0x6b].custom_cmp_param = (void *)(sVar10 + 1);
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114b6e;
      fdb_doc_create((fdb_doc **)ppvVar17,pfVar27 + -99,8,(void *)0x0,0,pp_Var34,
                     (size_t)pfVar27[-0x6b].custom_cmp_param);
      pfVar14 = (fdb_doc *)*ppvVar17;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114b7b;
      fdb_set((fdb_kvs_handle *)pfVar27[-0x69].custom_cmp,pfVar14);
      lVar39 = lVar39 + 0xb;
      uVar9 = (ulong)((int)uVar9 + 1);
      ppvVar17 = ppvVar17 + 1;
    } while (lVar39 != 0x6e);
    pfVar18 = pfVar27 + -0x69;
    uVar5 = *(undefined7 *)&pfVar27[-0x6a].field_0x1;
    pfVar18->create_if_missing = pfVar27[-0x6a].create_if_missing;
    *(undefined7 *)&pfVar18->field_0x1 = uVar5;
    pfVar15 = (fdb_kvs_handle *)pfVar27[-0x69].custom_cmp;
    *(undefined4 *)&pfVar27[-0x6b].custom_cmp_param = 0;
    pfVar19 = (fdb_kvs_config *)0x0;
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114bba;
    fdb_iterator_init(pfVar15,(fdb_iterator **)&pfVar27[-0x6a].custom_cmp,(void *)0x0,0,(void *)0x0,
                      0,*(fdb_iterator_opt_t *)&pfVar27[-0x6b].custom_cmp_param);
    uVar40 = 0;
    uVar41 = 0xbff00000;
    do {
      *(ulong *)(pfVar27 + -0x6a) = CONCAT44(uVar41,uVar40);
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114bda;
      pcVar38 = (code *)&pfVar27[-0x6a].custom_cmp_param;
      fVar7 = fdb_iterator_get((fdb_iterator *)pfVar27[-0x6a].custom_cmp,
                               (fdb_doc **)&pfVar27[-0x6a].custom_cmp_param);
      if (fVar7 != FDB_RESULT_SUCCESS) {
LAB_00114e2d:
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e32;
        custom_compare_primitive_test();
        goto LAB_00114e32;
      }
      pfVar14 = (fdb_doc *)pfVar27[-0x6a].custom_cmp_param;
      sVar10 = pfVar14->keylen;
      pcVar38 = (code *)pfVar14->key;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114bf6;
      memcpy(pfVar18,pcVar38,sVar10);
      dVar42 = *(double *)(pfVar27 + -0x69);
      if (dVar42 < *(double *)(pfVar27 + -0x6a) || dVar42 == *(double *)(pfVar27 + -0x6a)) {
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e2d;
        custom_compare_primitive_test();
        goto LAB_00114e2d;
      }
      *(double *)(pfVar27 + -0x6a) = dVar42;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114c16;
      fdb_doc_free(pfVar14);
      pfVar27[-0x6a].custom_cmp_param = (void *)0x0;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114c29;
      fVar7 = fdb_iterator_next((fdb_iterator *)pfVar27[-0x6a].custom_cmp);
      uVar40 = (undefined4)*(undefined8 *)(pfVar27 + -0x6a);
      uVar41 = (undefined4)((ulong)*(undefined8 *)(pfVar27 + -0x6a) >> 0x20);
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114c41;
    fdb_iterator_close((fdb_iterator *)pfVar27[-0x6a].custom_cmp);
    pfVar36 = (fdb_file_handle *)pfVar27[-0x69].custom_cmp_param;
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114c50;
    fdb_commit(pfVar36,'\x01');
    pfVar15 = (fdb_kvs_handle *)pfVar27[-0x69].custom_cmp;
    *(undefined4 *)&pfVar27[-0x6b].custom_cmp_param = 0;
    pfVar19 = (fdb_kvs_config *)0x0;
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114c6e;
    fdb_iterator_init(pfVar15,(fdb_iterator **)&pfVar27[-0x6a].custom_cmp,(void *)0x0,0,(void *)0x0,
                      0,*(fdb_iterator_opt_t *)&pfVar27[-0x6b].custom_cmp_param);
    uVar40 = 0;
    uVar41 = 0xbff00000;
    do {
      *(ulong *)(pfVar27 + -0x6a) = CONCAT44(uVar41,uVar40);
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114c93;
      pcVar38 = (code *)&pfVar27[-0x6a].custom_cmp_param;
      fVar7 = fdb_iterator_get((fdb_iterator *)pfVar27[-0x6a].custom_cmp,
                               (fdb_doc **)&pfVar27[-0x6a].custom_cmp_param);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00114e37;
      pfVar14 = (fdb_doc *)pfVar27[-0x6a].custom_cmp_param;
      sVar10 = pfVar14->keylen;
      pcVar38 = (code *)pfVar14->key;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114caf;
      memcpy(pfVar27 + -0x69,pcVar38,sVar10);
      dVar42 = *(double *)(pfVar27 + -0x69);
      if (dVar42 < *(double *)(pfVar27 + -0x6a) || dVar42 == *(double *)(pfVar27 + -0x6a))
      goto LAB_00114e32;
      *(double *)(pfVar27 + -0x6a) = dVar42;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114ccf;
      fdb_doc_free(pfVar14);
      pfVar27[-0x6a].custom_cmp_param = (void *)0x0;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114ce2;
      fVar7 = fdb_iterator_next((fdb_iterator *)pfVar27[-0x6a].custom_cmp);
      uVar40 = (undefined4)*(undefined8 *)(pfVar27 + -0x6a);
      uVar41 = (undefined4)((ulong)*(undefined8 *)(pfVar27 + -0x6a) >> 0x20);
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114cfa;
    fdb_iterator_close((fdb_iterator *)pfVar27[-0x6a].custom_cmp);
    pfVar36 = (fdb_file_handle *)pfVar27[-0x69].custom_cmp_param;
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114d0b;
    fdb_compact(pfVar36,"./dummy2");
    pfVar15 = (fdb_kvs_handle *)pfVar27[-0x69].custom_cmp;
    *(undefined4 *)&pfVar27[-0x6b].custom_cmp_param = 0;
    pfVar19 = (fdb_kvs_config *)0x0;
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114d29;
    fdb_iterator_init(pfVar15,(fdb_iterator **)&pfVar27[-0x6a].custom_cmp,(void *)0x0,0,(void *)0x0,
                      0,*(fdb_iterator_opt_t *)&pfVar27[-0x6b].custom_cmp_param);
    uVar40 = 0;
    uVar41 = 0xbff00000;
    while( true ) {
      *(ulong *)(pfVar27 + -0x6a) = CONCAT44(uVar41,uVar40);
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114d4e;
      pcVar38 = (code *)&pfVar27[-0x6a].custom_cmp_param;
      fVar7 = fdb_iterator_get((fdb_iterator *)pfVar27[-0x6a].custom_cmp,
                               (fdb_doc **)&pfVar27[-0x6a].custom_cmp_param);
      if (fVar7 != FDB_RESULT_SUCCESS) break;
      pfVar14 = (fdb_doc *)pfVar27[-0x6a].custom_cmp_param;
      sVar10 = pfVar14->keylen;
      pcVar38 = (code *)pfVar14->key;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114d6a;
      memcpy(pfVar27 + -0x69,pcVar38,sVar10);
      dVar42 = *(double *)(pfVar27 + -0x69);
      if (dVar42 < *(double *)(pfVar27 + -0x6a) || dVar42 == *(double *)(pfVar27 + -0x6a))
      goto LAB_00114e3c;
      *(double *)(pfVar27 + -0x6a) = dVar42;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114d8a;
      fdb_doc_free(pfVar14);
      pfVar27[-0x6a].custom_cmp_param = (void *)0x0;
      pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114d9d;
      fVar7 = fdb_iterator_next((fdb_iterator *)pfVar27[-0x6a].custom_cmp);
      uVar40 = (undefined4)*(undefined8 *)(pfVar27 + -0x6a);
      uVar41 = (undefined4)((ulong)*(undefined8 *)(pfVar27 + -0x6a) >> 0x20);
      if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114db2;
        fdb_iterator_close((fdb_iterator *)pfVar27[-0x6a].custom_cmp);
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114dbc;
        fdb_kvs_close((fdb_kvs_handle *)pfVar27[-0x69].custom_cmp);
        pfVar36 = (fdb_file_handle *)pfVar27[-0x69].custom_cmp_param;
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114dc6;
        fdb_close(pfVar36);
        lVar39 = 0;
        do {
          pfVar14 = *(fdb_doc **)((long)pfVar27 + lVar39 * 8 + -0x998);
          pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114dd2;
          fdb_doc_free(pfVar14);
          lVar39 = lVar39 + 1;
        } while (lVar39 != 10);
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114de0;
        fdb_shutdown();
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114de5;
        memleak_end();
        pcVar35 = "%s PASSED\n";
        if (custom_compare_primitive_test()::__test_pass != '\0') {
          pcVar35 = "%s FAILED\n";
        }
        pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e16;
        fprintf(_stderr,pcVar35,"custom compare function for primitive key test");
        return;
      }
    }
LAB_00114e41:
    pfVar27[-0x6b].custom_cmp = (fdb_custom_cmp_variable)0x114e46;
    custom_compare_primitive_test();
  }
  pfVar27[-0x6b].custom_cmp = _cmp_double;
  custom_compare_primitive_test();
  if (((void **)pcVar38 != (void **)0x0) && (pfVar19 == (fdb_kvs_config *)0x0)) {
    return;
  }
  return;
}

Assistant:

void multi_thread_test(
    size_t ndocs, size_t wal_threshold, size_t time_sec,
    size_t nbatch, size_t compact_term, size_t nwriters, size_t nreaders)
{
    TEST_INIT();

    size_t nwrites, nreads;
    int i, r;
    int n = nwriters + nreaders;;
    thread_t *tid = alca(thread_t, n);
    void **thread_ret = alca(void *, n);
    struct work_thread_args *args = alca(struct work_thread_args, n);
    struct timeval ts_begin, ts_cur, ts_gap;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, ndocs);
    fdb_status status;
    fdb_kvs_info kvs_info;

    int filename_count = 1;
    int n_opened = 0;
    spin_t filename_count_lock;
    spin_init(&filename_count_lock);

    char keybuf[1024], metabuf[1024], bodybuf[1024], temp[1024];

    // remove previous dummy files
    r = system(SHELL_DEL" " FILENAME "* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    memleak_start();

    // initial population ===
    DBG("Initialize..\n");

    // open db
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_thread_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_begin, NULL);

    // insert documents
    for (i = 0; (size_t)i < ndocs; ++i){
        _set_random_string_smallabt(temp, KSIZE - (IDX_DIGIT+1));
        sprintf(keybuf, "k%0" IDX_DIGIT_STR "d%s", i, temp);

        sprintf(metabuf, "m%0" IDX_DIGIT_STR "d", i);

        _set_random_string_smallabt(temp, VSIZE-(IDX_DIGIT*2+1));
        sprintf(bodybuf, "b%0" IDX_DIGIT_STR "d%0" IDX_DIGIT_STR "d%s", i, 0, temp);

        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);
    //DBG("%d.%09d seconds elapsed\n", (int)ts_gap.tv_sec, (int)ts_gap.tv_nsec);

    fdb_kvs_close(db);
    fdb_close(dbfile);
    // end of population ===

    // drop OS's page cache
    //r = system("free && sync && echo 3 > /proc/sys/vm/drop_caches && free");

    // create workers
    for (i=0;i<n;++i){
        args[i].tid = i;
        args[i].nthreads = n;
        args[i].writer = (((size_t)i<nwriters)?(1):(0));
        args[i].ndocs = ndocs;
        args[i].doc = doc;
        args[i].time_sec = time_sec;
        args[i].nbatch = nbatch;
        args[i].compact_term = compact_term;
        args[i].n_opened = &n_opened;
        args[i].filename_count = &filename_count;
        args[i].filename_count_lock = &filename_count_lock;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        thread_create(&tid[i], _worker_thread, &args[i]);
    }

    printf("wait for %d seconds..\n", (int)time_sec);

    // wait for thread termination
    for (i=0;i<n;++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (i=0;(size_t)i<ndocs;++i){
        fdb_doc_free(doc[i]);
    }

    nwrites = nreads = 0;
    for (i=0;i<n;++i){
        if (args[i].writer) {
            nwrites += args[i].nops;
        } else {
            nreads += args[i].nops;
        }
    }
    printf("read: %.1f ops/sec\n", (double)nreads/time_sec);
    printf("write: %.1f ops/sec\n", (double)nwrites/time_sec);

    // check sequence number
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == ndocs+nwrites);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // shutdown
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("multi thread test");
}